

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatabuffer_p.h
# Opt level: O2

void __thiscall
QDataBuffer<QPathSegments::Intersection>::reserve
          (QDataBuffer<QPathSegments::Intersection> *this,qsizetype size)

{
  long lVar1;
  Intersection *pIVar2;
  
  lVar1 = this->capacity;
  if (lVar1 < size) {
    if (lVar1 != 0) goto LAB_003a4045;
    lVar1 = 1;
    while( true ) {
      this->capacity = lVar1;
LAB_003a4045:
      if (size <= lVar1) break;
      lVar1 = lVar1 * 2;
    }
    pIVar2 = (Intersection *)QtPrivate::fittedRealloc(this->buffer,0,&this->capacity,0x10,0);
    this->buffer = pIVar2;
  }
  return;
}

Assistant:

void reserve(qsizetype size) {
        if (size > capacity) {
            if (capacity == 0)
                capacity = 1;
            while (capacity < size)
                capacity *= 2;
            buffer = (Type*) QtPrivate::fittedRealloc(static_cast<void*>(buffer), 0, &capacity, sizeof(Type));
            Q_CHECK_PTR(buffer);
        }
    }